

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
helics::make_cloning_filter(FilterTypes type,Core *core,string_view delivery,string_view name)

{
  string_view endpoint;
  bool bVar1;
  Core **in_RDX;
  tuple<helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_> in_RDI;
  __single_object *dfilt;
  Core *in_stack_00000100;
  FilterTypes in_stack_0000010c;
  Filter *in_stack_00000110;
  __uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> this;
  CloningFilter *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  uint7 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  uVar2 = 0;
  this._M_t.
  super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl =
       (tuple<helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>)
       (tuple<helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>)
       in_RDI.
       super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
       super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
  std::
  make_unique<helics::CloningFilter,helics::Core*&,std::basic_string_view<char,std::char_traits<char>>&>
            (in_RDX,(basic_string_view<char,_std::char_traits<char>_> *)
                    (ulong)in_stack_ffffffffffffffd0);
  std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::get
            ((unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
             this._M_t.
             super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
             .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl);
  addOperations(in_stack_00000110,in_stack_0000010c,in_stack_00000100);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (!bVar1) {
    std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::operator->
              ((unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
               0x39fea4);
    endpoint._M_str._0_7_ = in_stack_ffffffffffffffd0;
    endpoint._M_len = in_stack_ffffffffffffffc8;
    endpoint._M_str._7_1_ = uVar2;
    CloningFilter::addDeliveryEndpoint(in_stack_ffffffffffffffc0,endpoint);
  }
  return (__uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
          )(__uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
             .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CloningFilter> make_cloning_filter(FilterTypes type,
                                                   Core* core,
                                                   std::string_view delivery,
                                                   std::string_view name)

{
    auto dfilt = std::make_unique<CloningFilter>(core, name);
    addOperations(dfilt.get(), type, core);
    if (!delivery.empty()) {
        dfilt->addDeliveryEndpoint(delivery);
    }
    return dfilt;
}